

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_interpolation_error
          (REF_DBL *metric,REF_DBL *hess,REF_GRID ref_grid,REF_DBL *interpolation_error)

{
  double dVar1;
  double dVar2;
  REF_NODE ref_node;
  uint uVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  REF_DBL det;
  REF_DBL error [6];
  REF_DBL m1neghalf [6];
  REF_DBL m1half [6];
  double local_d0;
  double local_c8 [3];
  double local_b0 [3];
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  if (0 < ref_node->max) {
    dVar1 = *(double *)(&DAT_002430b0 + (ulong)(ref_grid->twod == 0) * 8);
    lVar4 = 0;
    do {
      if ((-1 < ref_node->global[lVar4]) && (ref_node->ref_mpi->id == ref_node->part[lVar4])) {
        uVar3 = ref_matrix_sqrt_m(metric,local_68,local_98);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x3ed,"ref_metric_interpolation_error",(ulong)uVar3,"m^-1/2");
          return uVar3;
        }
        uVar3 = ref_matrix_mult_m0m1m0(local_98,hess,local_c8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x3ef,"ref_metric_interpolation_error",(ulong)uVar3,"error=m1half*hess*m1half");
          return uVar3;
        }
        uVar3 = ref_matrix_det_m(metric,&local_d0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x3f0,"ref_metric_interpolation_error",(ulong)uVar3,"det");
          return uVar3;
        }
        bVar5 = ref_grid->twod == 0;
        dVar6 = local_c8[0];
        if (bVar5) {
          dVar6 = local_c8[0] + local_b0[0];
        }
        interpolation_error[lVar4] = (dVar6 + local_b0[(ulong)bVar5 * 2]) * dVar1;
        if (local_d0 >= 0.0) {
          if (local_d0 < 0.0) {
            dVar6 = sqrt(local_d0);
          }
          else {
            dVar6 = SQRT(local_d0);
          }
          dVar7 = dVar6 * 1e+20;
          if (dVar7 <= -dVar7) {
            dVar7 = -dVar7;
          }
          dVar2 = interpolation_error[lVar4];
          dVar8 = dVar2;
          if (dVar2 <= -dVar2) {
            dVar8 = -dVar2;
          }
          if (dVar8 < dVar7) {
            interpolation_error[lVar4] = dVar2 / dVar6;
            goto LAB_001f4287;
          }
        }
        interpolation_error[lVar4] = 0.0;
      }
LAB_001f4287:
      lVar4 = lVar4 + 1;
      hess = hess + 6;
      metric = metric + 6;
    } while (lVar4 < ref_node->max);
  }
  uVar3 = ref_node_ghost_dbl(ref_node,interpolation_error,1);
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x402,
           "ref_metric_interpolation_error",(ulong)uVar3,"update ghosts");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolation_error(
    REF_DBL *metric, REF_DBL *hess, REF_GRID ref_grid,
    REF_DBL *interpolation_error) {
  /* Corollary 3.4 CONTINUOUS MESH FRAMEWORK PART I DOI:10.1137/090754078 */
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL error[6], m1half[6], m1neghalf[6], det, sqrt_det;
  REF_DBL constant = 1.0 / 10.0;
  if (ref_grid_twod(ref_grid)) {
    constant = 1.0 / 8.0;
  }
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_sqrt_m(&(metric[6 * node]), m1half, m1neghalf), "m^-1/2");
      RSS(ref_matrix_mult_m0m1m0(m1neghalf, &(hess[6 * node]), error),
          "error=m1half*hess*m1half");
      RSS(ref_matrix_det_m(&(metric[6 * node]), &det), "det");
      if (ref_grid_twod(ref_grid)) {
        interpolation_error[node] = constant * (error[0] + error[3]);
      } else {
        interpolation_error[node] = constant * (error[0] + error[3] + error[5]);
      }
      if (det >= 0.0) {
        sqrt_det = sqrt(det);
        if (ref_math_divisible(interpolation_error[node], sqrt_det)) {
          interpolation_error[node] /= sqrt_det;
        } else {
          interpolation_error[node] = 0.0;
        }
      } else {
        interpolation_error[node] = 0.0;
      }
    }
  }
  RSS(ref_node_ghost_dbl(ref_node, interpolation_error, 1), "update ghosts");

  return REF_SUCCESS;
}